

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNumberTreeObjectHelper::iterator::iterator(iterator *this,shared_ptr<NNTreeIterator> *i)

{
  shared_ptr<NNTreeIterator> *i_local;
  iterator *this_local;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_0058f798;
  std::shared_ptr<NNTreeIterator>::shared_ptr(&this->impl,i);
  std::pair<long_long,_QPDFObjectHandle>::pair<long_long,_QPDFObjectHandle,_true>(&this->ivalue);
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator::iterator(std::shared_ptr<NNTreeIterator> const& i) :
    impl(i)
{
}